

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theory.cpp
# Opt level: O0

Comparison
Kernel::RationalConstantType::comparePrecedence(RationalConstantType *n1,RationalConstantType *n2)

{
  IntegerConstantType *in_RSI;
  Comparison prec;
  IntegerConstantType *in_stack_ffffffffffffff90;
  IntegerConstantType *in_stack_ffffffffffffff98;
  undefined4 local_4;
  
  IntegerConstantType::IntegerConstantType(in_stack_ffffffffffffff90,in_RSI);
  IntegerConstantType::IntegerConstantType(in_stack_ffffffffffffff90,in_RSI);
  local_4 = IntegerConstantType::comparePrecedence
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x9b1623);
  IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x9b162d);
  if (local_4 == EQUAL) {
    IntegerConstantType::IntegerConstantType(in_stack_ffffffffffffff90,in_RSI);
    IntegerConstantType::IntegerConstantType(in_stack_ffffffffffffff90,in_RSI);
    local_4 = IntegerConstantType::comparePrecedence
                        (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x9b16cb);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x9b16d5);
  }
  return local_4;
}

Assistant:

Comparison RationalConstantType::comparePrecedence(RationalConstantType n1, RationalConstantType n2)
{
  auto prec = IntegerConstantType::comparePrecedence(n1._den, n2._den);
  if (prec != EQUAL) return prec;
  return IntegerConstantType::comparePrecedence(n1._num, n2._num);
}